

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blk_sse_sum_sse2.c
# Opt level: O0

void sse_sum_wd4_sse2(int16_t *data,int stride,int bh,int *x_sum,int64_t *x2_sum)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  int *in_RCX;
  int in_EDX;
  int in_ESI;
  undefined8 *in_RDI;
  long *in_R8;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  __m128i temp_buffer2;
  __m128i temp_buffer1;
  int16_t *data_tmp;
  undefined4 local_2ec;
  undefined4 local_2e8;
  undefined4 uStack_2e4;
  undefined4 uStack_2e0;
  undefined4 uStack_2dc;
  undefined4 local_2d8;
  undefined4 uStack_2d4;
  undefined4 uStack_2d0;
  undefined4 uStack_2cc;
  undefined8 local_258;
  undefined4 local_108;
  undefined4 uStack_104;
  undefined4 uStack_100;
  undefined4 uStack_fc;
  undefined4 local_e8;
  undefined4 uStack_e4;
  undefined4 uStack_e0;
  undefined4 uStack_dc;
  int j;
  __m128i regx2_sum;
  __m128i regx_sum;
  __m128i one;
  __m128i sse_buffer;
  __m128i sum_buffer;
  __m128i load_pixels_hi;
  __m128i load_pixels_low;
  
  local_2d8 = 0;
  uStack_2d4 = 0;
  uStack_2d0 = 0;
  uStack_2cc = 0;
  local_2e8 = 0;
  uStack_2e4 = 0;
  uStack_2e0 = 0;
  uStack_2dc = 0;
  local_258 = in_RDI;
  for (local_2ec = 0; local_2ec < in_EDX >> 1; local_2ec = local_2ec + 1) {
    uVar1 = *local_258;
    uVar2 = *(undefined8 *)((long)local_258 + (long)in_ESI * 2);
    auVar4._8_8_ = uVar2;
    auVar4._0_8_ = uVar1;
    auVar5._8_8_ = 0x1000100010001;
    auVar5._0_8_ = 0x1000100010001;
    auVar5 = pmaddwd(auVar4,auVar5);
    auVar3._8_8_ = uVar2;
    auVar3._0_8_ = uVar1;
    auVar6._8_8_ = uVar2;
    auVar6._0_8_ = uVar1;
    auVar6 = pmaddwd(auVar3,auVar6);
    local_e8 = auVar5._0_4_;
    uStack_e4 = auVar5._4_4_;
    uStack_e0 = auVar5._8_4_;
    uStack_dc = auVar5._12_4_;
    local_2d8 = local_e8 + local_2d8;
    uStack_2d4 = uStack_e4 + uStack_2d4;
    uStack_2d0 = uStack_e0 + uStack_2d0;
    uStack_2cc = uStack_dc + uStack_2cc;
    local_108 = auVar6._0_4_;
    uStack_104 = auVar6._4_4_;
    uStack_100 = auVar6._8_4_;
    uStack_fc = auVar6._12_4_;
    local_2e8 = local_108 + local_2e8;
    uStack_2e4 = uStack_104 + uStack_2e4;
    uStack_2e0 = uStack_100 + uStack_2e0;
    uStack_2dc = uStack_fc + uStack_2dc;
    local_258 = (undefined8 *)((long)local_258 + (long)(in_ESI << 1) * 2);
  }
  *in_RCX = local_2d8 + uStack_2d0 + uStack_2d4 + uStack_2cc;
  *in_R8 = (ulong)local_2e8 + (ulong)uStack_2e0 + (ulong)uStack_2e4 + (ulong)uStack_2dc + *in_R8;
  return;
}

Assistant:

static inline void sse_sum_wd4_sse2(const int16_t *data, int stride, int bh,
                                    int *x_sum, int64_t *x2_sum) {
  const int16_t *data_tmp = data;
  __m128i temp_buffer1, temp_buffer2;
  __m128i load_pixels_low, load_pixels_hi, sum_buffer, sse_buffer;
  __m128i one = _mm_set1_epi16(1);
  __m128i regx_sum = _mm_setzero_si128();
  __m128i regx2_sum = regx_sum;

  for (int j = 0; j < (bh >> 1); ++j) {
    // Load 2 rows (8 pixels) at a time.
    load_pixels_low = _mm_loadl_epi64((__m128i const *)(data_tmp));
    load_pixels_hi = _mm_loadl_epi64((__m128i const *)(data_tmp + stride));
    load_pixels_low = _mm_unpacklo_epi64(load_pixels_low, load_pixels_hi);
    sum_buffer = _mm_madd_epi16(load_pixels_low, one);
    sse_buffer = _mm_madd_epi16(load_pixels_low, load_pixels_low);
    regx_sum = _mm_add_epi32(sum_buffer, regx_sum);
    regx2_sum = _mm_add_epi32(sse_buffer, regx2_sum);
    data_tmp += 2 * stride;
  }

  regx_sum = _mm_add_epi32(regx_sum, _mm_srli_si128(regx_sum, 8));
  regx_sum = _mm_add_epi32(regx_sum, _mm_srli_si128(regx_sum, 4));
  *x_sum = _mm_cvtsi128_si32(regx_sum);
  temp_buffer1 = _mm_unpacklo_epi32(regx2_sum, _mm_setzero_si128());
  temp_buffer2 = _mm_unpackhi_epi32(regx2_sum, _mm_setzero_si128());
  regx2_sum = _mm_add_epi64(temp_buffer1, temp_buffer2);
  regx2_sum = _mm_add_epi64(regx2_sum, _mm_srli_si128(regx2_sum, 8));
#if AOM_ARCH_X86_64
  *x2_sum += _mm_cvtsi128_si64(regx2_sum);
#else
  {
    int64_t tmp;
    _mm_storel_epi64((__m128i *)&tmp, regx2_sum);
    *x2_sum += tmp;
  }
#endif
}